

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf_test.cc
# Opt level: O0

void __thiscall PBKDFTest_RFC6070Vectors_Test::TestBody(PBKDFTest_RFC6070Vectors_Test *this)

{
  bool bVar1;
  EVP_MD *pEVar2;
  char *pcVar3;
  AssertHelper local_258;
  Message local_250;
  Bytes local_248;
  Span<const_unsigned_char> local_238;
  Bytes local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1e8;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__2;
  Message local_1b8;
  Bytes local_1b0;
  Span<const_unsigned_char> local_1a0;
  Bytes local_190;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  Message local_120;
  Bytes local_118;
  Span<const_unsigned_char> local_108;
  Bytes local_f8;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8 [3];
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  uint8_t key [20];
  uchar auStack_58 [8];
  uint8_t kKey3 [16];
  uint8_t kKey2 [20];
  uchar auStack_28 [8];
  uint8_t kKey1 [20];
  PBKDFTest_RFC6070Vectors_Test *this_local;
  
  auStack_28[0] = '\f';
  auStack_28[1] = '`';
  auStack_28[2] = 200;
  auStack_28[3] = '\x0f';
  auStack_28[4] = 0x96;
  auStack_28[5] = '\x1f';
  auStack_28[6] = '\x0e';
  auStack_28[7] = 'q';
  kKey1[0] = 0xf3;
  kKey1[1] = 0xa9;
  kKey1[2] = 0xb5;
  kKey1[3] = '$';
  kKey1[4] = 0xaf;
  kKey1[5] = '`';
  kKey1[6] = '\x12';
  kKey1[7] = '\x06';
  kKey1[8] = '/';
  kKey1[9] = 0xe0;
  kKey1[10] = '7';
  kKey1[0xb] = 0xa6;
  kKey3[8] = 0xea;
  kKey3[9] = 'l';
  kKey3[10] = '\x01';
  kKey3[0xb] = 'M';
  kKey3[0xc] = 199;
  kKey3[0xd] = '-';
  kKey3[0xe] = 'o';
  kKey3[0xf] = 0x8c;
  auStack_58[0] = 'V';
  auStack_58[1] = 0xfa;
  auStack_58[2] = 'j';
  auStack_58[3] = 0xa7;
  auStack_58[4] = 'U';
  auStack_58[5] = 'H';
  auStack_58[6] = '\t';
  auStack_58[7] = 0x9d;
  kKey3[0] = 0xcc;
  kKey3[1] = '7';
  kKey3[2] = 0xd7;
  kKey3[3] = 0xf0;
  kKey3[4] = '4';
  kKey3[5] = '%';
  kKey3[6] = 0xe0;
  kKey3[7] = 0xc3;
  unique0x10000ae9 = this;
  pEVar2 = EVP_sha1();
  local_8c = PKCS5_PBKDF2_HMAC("password",8,"salt",4,1,pEVar2,0x14,(uchar *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_88,&local_8c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_88,
               (AssertionResult *)
               "PKCS5_PBKDF2_HMAC(\"password\", 8, (const uint8_t *)\"salt\", 4, 1, EVP_sha1(), sizeof(kKey1), key)"
               ,"false","true",(char *)pEVar2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(local_a8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    bssl::Span<unsigned_char_const>::Span<20ul>
              ((Span<unsigned_char_const> *)&local_108,(uchar (*) [20])auStack_28);
    Bytes::Bytes(&local_f8,local_108);
    Bytes::Bytes(&local_118,(uint8_t *)&gtest_ar_.message_,0x14);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_e8,"Bytes(kKey1)","Bytes(key, sizeof(kKey1))",&local_f8,&local_118)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x4c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    pEVar2 = EVP_sha1();
    local_13c = PKCS5_PBKDF2_HMAC("password",8,"salt",4,2,pEVar2,0x14,(uchar *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_138,&local_13c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_138,
                 (AssertionResult *)
                 "PKCS5_PBKDF2_HMAC(\"password\", 8, (const uint8_t *)\"salt\", 4, 2, EVP_sha1(), sizeof(kKey2), key)"
                 ,"false","true",(char *)pEVar2);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x4f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_148);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      bssl::Span<unsigned_char_const>::Span<20ul>
                ((Span<unsigned_char_const> *)&local_1a0,(uchar (*) [20])(kKey3 + 8));
      Bytes::Bytes(&local_190,local_1a0);
      Bytes::Bytes(&local_1b0,(uint8_t *)&gtest_ar_.message_,0x14);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_180,"Bytes(kKey2)","Bytes(key, sizeof(kKey2))",&local_190,
                 &local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                   ,0x50,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1b8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_1b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      pEVar2 = EVP_sha1();
      local_1d4 = PKCS5_PBKDF2_HMAC("pass",9,(uchar *)"sa",5,0x1000,pEVar2,0x10,
                                    (uchar *)&gtest_ar_.message_);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_1d0,&local_1d4,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_1d0,
                   (AssertionResult *)
                   "PKCS5_PBKDF2_HMAC(\"pass\\0word\", 9, (const uint8_t *)\"sa\\0lt\", 5, 4096, EVP_sha1(), sizeof(kKey3), key)"
                   ,"false","true",(char *)pEVar2);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                   ,0x53,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1e0);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        bssl::Span<unsigned_char_const>::Span<16ul>
                  ((Span<unsigned_char_const> *)&local_238,(uchar (*) [16])auStack_58);
        Bytes::Bytes(&local_228,local_238);
        Bytes::Bytes(&local_248,(uint8_t *)&gtest_ar_.message_,0x10);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_218,"Bytes(kKey3)","Bytes(key, sizeof(kKey3))",&local_228,
                   &local_248);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
        if (!bVar1) {
          testing::Message::Message(&local_250);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
          testing::internal::AssertHelper::AssertHelper
                    (&local_258,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                     ,0x54,pcVar3);
          testing::internal::AssertHelper::operator=(&local_258,&local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_258);
          testing::Message::~Message(&local_250);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      }
    }
  }
  return;
}

Assistant:

TEST(PBKDFTest, RFC6070Vectors) {
  const uint8_t kKey1[] = {0x0c, 0x60, 0xc8, 0x0f, 0x96, 0x1f, 0x0e,
                           0x71, 0xf3, 0xa9, 0xb5, 0x24, 0xaf, 0x60,
                           0x12, 0x06, 0x2f, 0xe0, 0x37, 0xa6};
  const uint8_t kKey2[] = {0xea, 0x6c, 0x01, 0x4d, 0xc7, 0x2d, 0x6f,
                           0x8c, 0xcd, 0x1e, 0xd9, 0x2a, 0xce, 0x1d,
                           0x41, 0xf0, 0xd8, 0xde, 0x89, 0x57};
  const uint8_t kKey3[] = {0x56, 0xfa, 0x6a, 0xa7, 0x55, 0x48, 0x09, 0x9d,
                           0xcc, 0x37, 0xd7, 0xf0, 0x34, 0x25, 0xe0, 0xc3};
  uint8_t key[sizeof(kKey1)];
  static_assert(sizeof(key) >= sizeof(kKey2), "output too small");
  static_assert(sizeof(key) >= sizeof(kKey3), "output too small");

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, (const uint8_t *)"salt", 4, 1,
                                EVP_sha1(), sizeof(kKey1), key));
  EXPECT_EQ(Bytes(kKey1), Bytes(key, sizeof(kKey1)));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, (const uint8_t *)"salt", 4, 2,
                                EVP_sha1(), sizeof(kKey2), key));
  EXPECT_EQ(Bytes(kKey2), Bytes(key, sizeof(kKey2)));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("pass\0word", 9, (const uint8_t *)"sa\0lt", 5,
                                4096, EVP_sha1(), sizeof(kKey3), key));
  EXPECT_EQ(Bytes(kKey3), Bytes(key, sizeof(kKey3)));
}